

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O0

int Ssc_ManCheckEquivalence(Ssc_Man_t *p,int iRepr,int iNode,int fCompl)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  abctime clk;
  int RetValue;
  int pLitsSat [2];
  int fCompl_local;
  int iNode_local;
  int iRepr_local;
  Ssc_Man_t *p_local;
  
  pLitsSat[0] = fCompl;
  pLitsSat[1] = iNode;
  if (iRepr == iNode) {
    __assert_fail("iRepr != iNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                  ,0x160,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
  }
  if (iNode < iRepr) {
    p_local._4_4_ = 0;
  }
  else {
    if (iNode <= iRepr) {
      __assert_fail("iRepr < iNode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                    ,0x163,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
    }
    if (iRepr != 0) {
      Ssc_ManCnfNodeAddToSolver(p,iRepr);
    }
    Ssc_ManCnfNodeAddToSolver(p,pLitsSat[1]);
    sat_solver_compress(p->pSat);
    iVar1 = Ssc_ObjSatVar(p,iRepr);
    clk._4_4_ = Abc_Var2Lit(iVar1,0);
    iVar1 = Ssc_ObjSatVar(p,pLitsSat[1]);
    RetValue = Abc_Var2Lit(iVar1,pLitsSat[0] ^ (uint)(0 < iRepr));
    aVar2 = Abc_Clock();
    clk._0_4_ = sat_solver_solve(p->pSat,(lit *)((long)&clk + 4),pLitsSat,(long)p->pPars->nBTLimit,0
                                 ,0,0);
    if ((int)clk == -1) {
      clk._4_4_ = Abc_LitNot(clk._4_4_);
      RetValue = Abc_LitNot(RetValue);
      clk._0_4_ = sat_solver_addclause(p->pSat,(lit *)((long)&clk + 4),pLitsSat);
      if ((int)clk == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                      ,0x17a,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
      }
      aVar3 = Abc_Clock();
      p->timeSatUnsat = (aVar3 - aVar2) + p->timeSatUnsat;
      if (iRepr == 0) {
        p_local._4_4_ = -1;
      }
      else {
        aVar2 = Abc_Clock();
        clk._0_4_ = sat_solver_solve(p->pSat,(lit *)((long)&clk + 4),pLitsSat,
                                     (long)p->pPars->nBTLimit,0,0,0);
        if ((int)clk == -1) {
          clk._4_4_ = Abc_LitNot(clk._4_4_);
          RetValue = Abc_LitNot(RetValue);
          clk._0_4_ = sat_solver_addclause(p->pSat,(lit *)((long)&clk + 4),pLitsSat);
          if ((int)clk == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                          ,0x196,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
          }
          aVar3 = Abc_Clock();
          p->timeSatUnsat = (aVar3 - aVar2) + p->timeSatUnsat;
          p_local._4_4_ = -1;
        }
        else if ((int)clk == 1) {
          Ssc_ManCollectSatPattern(p,p->vPattern);
          aVar3 = Abc_Clock();
          p->timeSatSat = (aVar3 - aVar2) + p->timeSatSat;
          p_local._4_4_ = 1;
        }
        else {
          aVar3 = Abc_Clock();
          p->timeSatUndec = (aVar3 - aVar2) + p->timeSatUndec;
          p_local._4_4_ = 0;
        }
      }
    }
    else if ((int)clk == 1) {
      Ssc_ManCollectSatPattern(p,p->vPattern);
      aVar3 = Abc_Clock();
      p->timeSatSat = (aVar3 - aVar2) + p->timeSatSat;
      p_local._4_4_ = 1;
    }
    else {
      aVar3 = Abc_Clock();
      p->timeSatUndec = (aVar3 - aVar2) + p->timeSatUndec;
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Ssc_ManCheckEquivalence( Ssc_Man_t * p, int iRepr, int iNode, int fCompl )
{
    int pLitsSat[2], RetValue;
    abctime clk;
    assert( iRepr != iNode );
    if ( iRepr > iNode )
        return l_Undef;
    assert( iRepr < iNode );
//    if ( p->nTimeOut )
//        sat_solver_set_runtime_limit( p->pSat, p->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );

    // create CNF
    if ( iRepr )
    Ssc_ManCnfNodeAddToSolver( p, iRepr );
    Ssc_ManCnfNodeAddToSolver( p, iNode );
    sat_solver_compress( p->pSat );

    // order the literals
    pLitsSat[0] = Abc_Var2Lit( Ssc_ObjSatVar(p, iRepr), 0 );
    pLitsSat[1] = Abc_Var2Lit( Ssc_ObjSatVar(p, iNode), fCompl ^ (int)(iRepr > 0) );

    // solve under assumptions
    // A = 1; B = 0
    clk = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, pLitsSat, pLitsSat + 2, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_False )
    {
        pLitsSat[0] = Abc_LitNot( pLitsSat[0] ); // compl
        pLitsSat[1] = Abc_LitNot( pLitsSat[1] ); // compl
        RetValue = sat_solver_addclause( p->pSat, pLitsSat, pLitsSat + 2 );
        assert( RetValue );
        p->timeSatUnsat += Abc_Clock() - clk;
    }
    else if ( RetValue == l_True )
    {
        Ssc_ManCollectSatPattern( p, p->vPattern );
        p->timeSatSat += Abc_Clock() - clk;
        return l_True;
    }
    else // if ( RetValue1 == l_Undef )
    {
        p->timeSatUndec += Abc_Clock() - clk;
        return l_Undef;
    }

    // if the old node was constant 0, we already know the answer
    if ( iRepr == 0 )
        return l_False;

    // solve under assumptions
    // A = 0; B = 1
    clk = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, pLitsSat, pLitsSat + 2, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_False )
    {
        pLitsSat[0] = Abc_LitNot( pLitsSat[0] );
        pLitsSat[1] = Abc_LitNot( pLitsSat[1] );
        RetValue = sat_solver_addclause( p->pSat, pLitsSat, pLitsSat + 2 );
        assert( RetValue );
        p->timeSatUnsat += Abc_Clock() - clk;
    }
    else if ( RetValue == l_True )
    {
        Ssc_ManCollectSatPattern( p, p->vPattern );
        p->timeSatSat += Abc_Clock() - clk;
        return l_True;
    }
    else // if ( RetValue1 == l_Undef )
    {
        p->timeSatUndec += Abc_Clock() - clk;
        return l_Undef;
    }
    return l_False;
}